

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

void __thiscall
spvtools::val::ValidationState_t::RegisterInstruction(ValidationState_t *this,Instruction *inst)

{
  uint16_t uVar1;
  uint32_t sampled_image_id;
  Instruction *this_00;
  StorageClass storage_class;
  iterator iVar2;
  size_t index;
  ulong uVar3;
  long lVar4;
  pointer psVar5;
  uint32_t local_40 [2];
  Instruction *local_38;
  
  local_40[0] = (inst->inst_).result_id;
  if (local_40[0] != 0) {
    local_38 = inst;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::Instruction*>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Instruction*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int,spvtools::val::Instruction*>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::Instruction*>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Instruction*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->all_definitions_);
  }
  psVar5 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((inst->operands_).
      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar5) {
    lVar4 = 4;
    uVar3 = 0;
    do {
      if (*(int *)((long)&psVar5->offset + lVar4) - 1U < 2) {
        sampled_image_id =
             (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[*(ushort *)((long)psVar5 + lVar4 + -4)];
        local_40[0] = sampled_image_id;
        iVar2 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->all_definitions_)._M_h,local_40);
        if ((iVar2.
             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
             ._M_cur != (__node_type *)0x0) &&
           (this_00 = *(Instruction **)
                       ((long)iVar2.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                              ._M_cur + 0x10), this_00 != (Instruction *)0x0)) {
          if ((*(int *)((long)&psVar5->offset + lVar4) == 1) && ((this_00->inst_).opcode == 0x56)) {
            RegisterSampledImageConsumer(this,sampled_image_id,inst);
          }
          if (inst->function_ != (Function *)0x0) {
            uVar1 = (this_00->inst_).opcode;
            if (uVar1 == 0x3b) {
              index = 2;
            }
            else {
              if (uVar1 != 0x20) goto LAB_006973ad;
              index = 1;
            }
            storage_class = Instruction::GetOperandAs<spv::StorageClass>(this_00,index);
            RegisterStorageClassConsumer(this,storage_class,inst);
          }
        }
      }
LAB_006973ad:
      uVar3 = uVar3 + 1;
      psVar5 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < (ulong)((long)(inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4));
  }
  return;
}

Assistant:

void ValidationState_t::RegisterInstruction(Instruction* inst) {
  if (inst->id()) all_definitions_.insert(std::make_pair(inst->id(), inst));

  // Some validation checks are easier by getting all the consumers
  for (size_t i = 0; i < inst->operands().size(); ++i) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    if ((SPV_OPERAND_TYPE_ID == operand.type) ||
        (SPV_OPERAND_TYPE_TYPE_ID == operand.type)) {
      const uint32_t operand_word = inst->word(operand.offset);
      Instruction* operand_inst = FindDef(operand_word);
      if (!operand_inst) {
        continue;
      }

      // If the instruction is using an OpTypeSampledImage as an operand, it
      // should be recorded. The validator will ensure that all usages of an
      // OpTypeSampledImage and its definition are in the same basic block.
      if ((SPV_OPERAND_TYPE_ID == operand.type) &&
          (spv::Op::OpSampledImage == operand_inst->opcode())) {
        RegisterSampledImageConsumer(operand_word, inst);
      }

      // In order to track storage classes (not Function) used per execution
      // model we can't use RegisterExecutionModelLimitation on instructions
      // like OpTypePointer which are going to be in the pre-function section.
      // Instead just need to register storage class usage for consumers in a
      // function block.
      if (inst->function()) {
        if (operand_inst->opcode() == spv::Op::OpTypePointer) {
          RegisterStorageClassConsumer(
              operand_inst->GetOperandAs<spv::StorageClass>(1), inst);
        } else if (operand_inst->opcode() == spv::Op::OpVariable) {
          RegisterStorageClassConsumer(
              operand_inst->GetOperandAs<spv::StorageClass>(2), inst);
        }
      }
    }
  }
}